

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

void * Bmcs_ManWorkerThread(void *pArg)

{
  int iVar1;
  
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0x10) == 0);
    if (*pArg == (solver_t *)0x0) break;
    iVar1 = satoko_solve_assumptions(*pArg,(int *)((long)pArg + 8),1);
    *(int *)((long)pArg + 0x14) = iVar1;
    *(undefined4 *)((long)pArg + 0x10) = 0;
  }
  pthread_exit((void *)0x0);
}

Assistant:

void * Bmcs_ManWorkerThread( void * pArg )
{
    Par_ThData_t * pThData = (Par_ThData_t *)pArg;
    volatile int * pPlace = &pThData->fWorking;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->fWorking );
        if ( pThData->pSat == NULL )
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }

        pThData->status = bmc_sat_solver_solve( pThData->pSat, &pThData->iLit, 1 );

        //printf( "Thread %d finished with status %d\n", pThData->iThread, pThData->status );

        pThData->fWorking = 0;
    }
    assert( 0 );
    return NULL;
}